

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.cc
# Opt level: O0

int crl_lookup(X509_CRL *crl,X509_REVOKED **ret,ASN1_INTEGER *serial,X509_NAME *issuer)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  ulong uStack_60;
  int is_sorted;
  size_t idx;
  X509_REVOKED *rev;
  X509_REVOKED rtmp;
  X509_NAME *issuer_local;
  ASN1_INTEGER *serial_local;
  X509_REVOKED **ret_local;
  X509_CRL *crl_local;
  
  bVar4 = true;
  if (serial->type != 2) {
    bVar4 = serial->type == 0x102;
  }
  rtmp._24_8_ = issuer;
  if (!bVar4) {
    __assert_fail("serial->type == V_ASN1_INTEGER || serial->type == V_ASN1_NEG_INTEGER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_crl.cc"
                  ,0x132,
                  "int crl_lookup(X509_CRL *, X509_REVOKED **, const ASN1_INTEGER *, X509_NAME *)");
  }
  rev = (X509_REVOKED *)serial;
  CRYPTO_MUTEX_lock_read(&g_crl_sort_lock);
  iVar2 = sk_X509_REVOKED_is_sorted(crl->crl->revoked);
  CRYPTO_MUTEX_unlock_read(&g_crl_sort_lock);
  if (iVar2 == 0) {
    CRYPTO_MUTEX_lock_write(&g_crl_sort_lock);
    iVar2 = sk_X509_REVOKED_is_sorted(crl->crl->revoked);
    if (iVar2 == 0) {
      sk_X509_REVOKED_sort(crl->crl->revoked);
    }
    CRYPTO_MUTEX_unlock_write(&g_crl_sort_lock);
  }
  iVar2 = sk_X509_REVOKED_find(crl->crl->revoked,&stack0xffffffffffffffa0,(X509_REVOKED *)&rev);
  if (iVar2 != 0) {
    for (; uVar1 = uStack_60, sVar3 = sk_X509_REVOKED_num(crl->crl->revoked), uVar1 < sVar3;
        uStack_60 = uStack_60 + 1) {
      idx = (size_t)sk_X509_REVOKED_value(crl->crl->revoked,uStack_60);
      iVar2 = ASN1_INTEGER_cmp((ASN1_INTEGER *)((X509_REVOKED *)idx)->serialNumber,
                               (ASN1_INTEGER *)serial);
      if (iVar2 != 0) {
        return 0;
      }
      iVar2 = crl_revoked_issuer_match(crl,(X509_NAME *)rtmp._24_8_,(X509_REVOKED *)idx);
      if (iVar2 != 0) {
        if (ret != (X509_REVOKED **)0x0) {
          *ret = (X509_REVOKED *)idx;
        }
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int crl_lookup(X509_CRL *crl, X509_REVOKED **ret,
                      const ASN1_INTEGER *serial, X509_NAME *issuer) {
  // Use an assert, rather than a runtime error, because returning nothing for a
  // CRL is arguably failing open, rather than closed.
  assert(serial->type == V_ASN1_INTEGER || serial->type == V_ASN1_NEG_INTEGER);
  X509_REVOKED rtmp, *rev;
  size_t idx;
  rtmp.serialNumber = (ASN1_INTEGER *)serial;
  // Sort revoked into serial number order if not already sorted. Do this
  // under a lock to avoid race condition.

  CRYPTO_MUTEX_lock_read(&g_crl_sort_lock);
  const int is_sorted = sk_X509_REVOKED_is_sorted(crl->crl->revoked);
  CRYPTO_MUTEX_unlock_read(&g_crl_sort_lock);

  if (!is_sorted) {
    CRYPTO_MUTEX_lock_write(&g_crl_sort_lock);
    if (!sk_X509_REVOKED_is_sorted(crl->crl->revoked)) {
      sk_X509_REVOKED_sort(crl->crl->revoked);
    }
    CRYPTO_MUTEX_unlock_write(&g_crl_sort_lock);
  }

  if (!sk_X509_REVOKED_find(crl->crl->revoked, &idx, &rtmp)) {
    return 0;
  }
  // Need to look for matching name
  for (; idx < sk_X509_REVOKED_num(crl->crl->revoked); idx++) {
    rev = sk_X509_REVOKED_value(crl->crl->revoked, idx);
    if (ASN1_INTEGER_cmp(rev->serialNumber, serial)) {
      return 0;
    }
    if (crl_revoked_issuer_match(crl, issuer, rev)) {
      if (ret) {
        *ret = rev;
      }
      return 1;
    }
  }
  return 0;
}